

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_tests.cpp
# Opt level: O3

void mempool_tests::MempoolAncestorIndexingTest_invoker(void)

{
  TestOpts opts;
  unit_test_log_t *puVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  MempoolAncestorIndexingTest t;
  undefined8 in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff900;
  pointer in_stack_fffffffffffff908;
  undefined8 in_stack_fffffffffffff910;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  undefined1 local_668 [376];
  undefined1 *local_4f0;
  long local_4e8;
  undefined1 local_4e0;
  undefined7 uStack_4df;
  undefined1 local_4d0 [376];
  undefined1 *local_358;
  long local_350;
  undefined1 local_348 [760];
  char local_50 [32];
  long local_30;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_670 = "";
  memset((ostringstream *)local_4d0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
  local_350 = 0;
  local_348[0] = 0;
  local_668[0] = 0x22;
  local_358 = local_348;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,local_668,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4d0,"MempoolAncestorIndexingTest",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  MempoolAncestorIndexingTest_invoker();
  local_688 = local_358;
  local_680 = local_358 + local_350;
  file.m_end = (iterator)0x131;
  file.m_begin = (iterator)&local_678;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file,(size_t)&local_688,msg);
  if (local_358 != local_348) {
    operator_delete(local_358,CONCAT71(local_348._1_7_,local_348[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
  std::ios_base::~ios_base((ios_base *)(local_4d0 + 0x70));
  local_668._0_8_ = (_func_int **)0x0;
  local_668._8_8_ = 0;
  local_668._16_8_ = 0;
  local_668._24_4_ = 0x1010101;
  local_668[0x1c] = 0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff900;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8f8;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff908;
  opts.coins_db_in_memory = (bool)(char)in_stack_fffffffffffff910;
  opts.block_tree_db_in_memory = (bool)(char)((ulong)in_stack_fffffffffffff910 >> 8);
  opts.setup_net = (bool)(char)((ulong)in_stack_fffffffffffff910 >> 0x10);
  opts.setup_validation_interface = (bool)(char)((ulong)in_stack_fffffffffffff910 >> 0x18);
  opts.min_validation_cache = (bool)(char)((ulong)in_stack_fffffffffffff910 >> 0x20);
  opts._29_3_ = (int3)((ulong)in_stack_fffffffffffff910 >> 0x28);
  TestingSetup::TestingSetup((TestingSetup *)local_4d0,MAIN,opts);
  if ((_func_int **)local_668._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_668._0_8_,local_668._16_8_ - local_668._0_8_);
  }
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_690 = "";
  memset((ostringstream *)local_668,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
  local_4e8 = 0;
  local_4e0 = 0;
  local_50[0] = '\"';
  local_4f0 = &local_4e0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_668,local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_668,"MempoolAncestorIndexingTest",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_668,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  MempoolAncestorIndexingTest_invoker();
  local_6a8 = local_4f0;
  local_6a0 = local_4f0 + local_4e8;
  file_00.m_end = (iterator)0x131;
  file_00.m_begin = (iterator)&local_698;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_00,(size_t)&local_6a8,msg_00);
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,CONCAT71(uStack_4df,local_4e0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
  std::ios_base::~ios_base((ios_base *)(local_668 + 0x70));
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6b0 = "";
  memset((ostringstream *)local_668,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
  local_4e8 = 0;
  local_4e0 = 0;
  local_50[0] = '\"';
  local_4f0 = &local_4e0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_668,local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_668,"MempoolAncestorIndexingTest",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_668,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  MempoolAncestorIndexingTest_invoker();
  local_6c8 = local_4f0;
  local_6c0 = local_4f0 + local_4e8;
  file_01.m_end = (iterator)0x131;
  file_01.m_begin = (iterator)&local_6b8;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_01,(size_t)&local_6c8,msg_01);
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,CONCAT71(uStack_4df,local_4e0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
  std::ios_base::~ios_base((ios_base *)(local_668 + 0x70));
  MempoolAncestorIndexingTest::test_method((MempoolAncestorIndexingTest *)local_4d0);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6d0 = "";
  memset((ostringstream *)local_668,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
  local_4e8 = 0;
  local_4e0 = 0;
  local_50[0] = '\"';
  local_4f0 = &local_4e0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_668,local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_668,"MempoolAncestorIndexingTest",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_668,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  MempoolAncestorIndexingTest_invoker();
  local_6e8 = local_4f0;
  local_6e0 = local_4f0 + local_4e8;
  file_02.m_end = (iterator)0x131;
  file_02.m_begin = (iterator)&local_6d8;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_02,(size_t)&local_6e8,msg_02);
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,CONCAT71(uStack_4df,local_4e0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
  std::ios_base::~ios_base((ios_base *)(local_668 + 0x70));
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  memset((ostringstream *)local_668,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
  local_4e8 = 0;
  local_4e0 = 0;
  local_50[0] = '\"';
  local_4f0 = &local_4e0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_668,local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_668,"MempoolAncestorIndexingTest",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_668,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  MempoolAncestorIndexingTest_invoker();
  file_03.m_end = (iterator)0x131;
  file_03.m_begin = &stack0xfffffffffffff908;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (puVar1,file_03,(size_t)&stack0xfffffffffffff8f8,msg_03);
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,CONCAT71(uStack_4df,local_4e0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
  std::ios_base::~ios_base((ios_base *)(local_668 + 0x70));
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)local_4d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(MempoolAncestorIndexingTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    /* 3rd highest fee */
    CMutableTransaction tx1 = CMutableTransaction();
    tx1.vout.resize(1);
    tx1.vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
    tx1.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(10000LL).FromTx(tx1));

    /* highest fee */
    CMutableTransaction tx2 = CMutableTransaction();
    tx2.vout.resize(1);
    tx2.vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
    tx2.vout[0].nValue = 2 * COIN;
    pool.addUnchecked(entry.Fee(20000LL).FromTx(tx2));
    uint64_t tx2Size = GetVirtualTransactionSize(CTransaction(tx2));

    /* lowest fee */
    CMutableTransaction tx3 = CMutableTransaction();
    tx3.vout.resize(1);
    tx3.vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
    tx3.vout[0].nValue = 5 * COIN;
    pool.addUnchecked(entry.Fee(0LL).FromTx(tx3));

    /* 2nd highest fee */
    CMutableTransaction tx4 = CMutableTransaction();
    tx4.vout.resize(1);
    tx4.vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
    tx4.vout[0].nValue = 6 * COIN;
    pool.addUnchecked(entry.Fee(15000LL).FromTx(tx4));

    /* equal fee rate to tx1, but newer */
    CMutableTransaction tx5 = CMutableTransaction();
    tx5.vout.resize(1);
    tx5.vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
    tx5.vout[0].nValue = 11 * COIN;
    pool.addUnchecked(entry.Fee(10000LL).FromTx(tx5));
    BOOST_CHECK_EQUAL(pool.size(), 5U);

    std::vector<std::string> sortedOrder;
    sortedOrder.resize(5);
    sortedOrder[0] = tx2.GetHash().ToString(); // 20000
    sortedOrder[1] = tx4.GetHash().ToString(); // 15000
    // tx1 and tx5 are both 10000
    // Ties are broken by hash, not timestamp, so determine which
    // hash comes first.
    if (tx1.GetHash() < tx5.GetHash()) {
        sortedOrder[2] = tx1.GetHash().ToString();
        sortedOrder[3] = tx5.GetHash().ToString();
    } else {
        sortedOrder[2] = tx5.GetHash().ToString();
        sortedOrder[3] = tx1.GetHash().ToString();
    }
    sortedOrder[4] = tx3.GetHash().ToString(); // 0

    CheckSort<ancestor_score>(pool, sortedOrder);

    /* low fee parent with high fee child */
    /* tx6 (0) -> tx7 (high) */
    CMutableTransaction tx6 = CMutableTransaction();
    tx6.vout.resize(1);
    tx6.vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
    tx6.vout[0].nValue = 20 * COIN;
    uint64_t tx6Size = GetVirtualTransactionSize(CTransaction(tx6));

    pool.addUnchecked(entry.Fee(0LL).FromTx(tx6));
    BOOST_CHECK_EQUAL(pool.size(), 6U);
    // Ties are broken by hash
    if (tx3.GetHash() < tx6.GetHash())
        sortedOrder.push_back(tx6.GetHash().ToString());
    else
        sortedOrder.insert(sortedOrder.end()-1,tx6.GetHash().ToString());

    CheckSort<ancestor_score>(pool, sortedOrder);

    CMutableTransaction tx7 = CMutableTransaction();
    tx7.vin.resize(1);
    tx7.vin[0].prevout = COutPoint(tx6.GetHash(), 0);
    tx7.vin[0].scriptSig = CScript() << OP_11;
    tx7.vout.resize(1);
    tx7.vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
    tx7.vout[0].nValue = 10 * COIN;
    uint64_t tx7Size = GetVirtualTransactionSize(CTransaction(tx7));

    /* set the fee to just below tx2's feerate when including ancestor */
    CAmount fee = (20000/tx2Size)*(tx7Size + tx6Size) - 1;

    pool.addUnchecked(entry.Fee(fee).FromTx(tx7));
    BOOST_CHECK_EQUAL(pool.size(), 7U);
    sortedOrder.insert(sortedOrder.begin()+1, tx7.GetHash().ToString());
    CheckSort<ancestor_score>(pool, sortedOrder);

    /* after tx6 is mined, tx7 should move up in the sort */
    std::vector<CTransactionRef> vtx;
    vtx.push_back(MakeTransactionRef(tx6));
    pool.removeForBlock(vtx, 1);

    sortedOrder.erase(sortedOrder.begin()+1);
    // Ties are broken by hash
    if (tx3.GetHash() < tx6.GetHash())
        sortedOrder.pop_back();
    else
        sortedOrder.erase(sortedOrder.end()-2);
    sortedOrder.insert(sortedOrder.begin(), tx7.GetHash().ToString());
    CheckSort<ancestor_score>(pool, sortedOrder);

    // High-fee parent, low-fee child
    // tx7 -> tx8
    CMutableTransaction tx8 = CMutableTransaction();
    tx8.vin.resize(1);
    tx8.vin[0].prevout  = COutPoint(tx7.GetHash(), 0);
    tx8.vin[0].scriptSig = CScript() << OP_11;
    tx8.vout.resize(1);
    tx8.vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
    tx8.vout[0].nValue = 10*COIN;

    // Check that we sort by min(feerate, ancestor_feerate):
    // set the fee so that the ancestor feerate is above tx1/5,
    // but the transaction's own feerate is lower
    pool.addUnchecked(entry.Fee(5000LL).FromTx(tx8));
    sortedOrder.insert(sortedOrder.end()-1, tx8.GetHash().ToString());
    CheckSort<ancestor_score>(pool, sortedOrder);
}